

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDispatcher.h
# Opt level: O2

void __thiscall cbtDispatcherInfo::cbtDispatcherInfo(cbtDispatcherInfo *this)

{
  this->m_timeStep = 0.0;
  this->m_stepCount = 0;
  this->m_dispatchFunc = 1;
  this->m_timeOfImpact = 1.0;
  this->m_useContinuous = true;
  this->m_debugDraw = (cbtIDebugDraw *)0x0;
  this->m_enableSatConvex = false;
  this->m_enableSPU = true;
  this->m_useEpa = true;
  this->m_allowedCcdPenetration = 0.04;
  this->m_useConvexConservativeDistanceUtil = false;
  this->m_convexConservativeDistanceThreshold = 0.0;
  this->m_deterministicOverlappingPairs = false;
  return;
}

Assistant:

cbtDispatcherInfo()
		: m_timeStep(cbtScalar(0.)),
		  m_stepCount(0),
		  m_dispatchFunc(DISPATCH_DISCRETE),
		  m_timeOfImpact(cbtScalar(1.)),
		  m_useContinuous(true),
		  m_debugDraw(0),
		  m_enableSatConvex(false),
		  m_enableSPU(true),
		  m_useEpa(true),
		  m_allowedCcdPenetration(cbtScalar(0.04)),
		  m_useConvexConservativeDistanceUtil(false),
		  m_convexConservativeDistanceThreshold(0.0f),
		  m_deterministicOverlappingPairs(false)
	{
	}